

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_table.c
# Opt level: O3

void objc_init_load_messages_table(void)

{
  pthread_mutex_t *__mutex;
  void *pvVar1;
  pthread_mutexattr_t recursiveAttributes;
  pthread_mutexattr_t local_14;
  
  __mutex = (pthread_mutex_t *)calloc(1,0x48);
  pthread_mutexattr_init(&local_14);
  pthread_mutexattr_settype(&local_14,1);
  pthread_mutex_init(__mutex,&local_14);
  pthread_mutexattr_destroy(&local_14);
  pvVar1 = calloc(0x1000,0x10);
  *(void **)((long)__mutex + 0x40) = pvVar1;
  __mutex[1].__data.__lock = 0x1000;
  load_table = (load_messages_table *)__mutex;
  loadSel = sel_registerName("load");
  return;
}

Assistant:

PRIVATE void objc_init_load_messages_table(void)
{
	load_messages_initialize(&load_table, 4096);
	loadSel = sel_registerName("load");
}